

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmu-uuid.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  runtime_error *this;
  allocator<char> local_dd;
  allocator<char> local_dc;
  allocator<char> local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Generates an UUID for an FMU.\nUsage:\n  fmu-uuid <input md.> <placeholder> <output md.> <output hdr.> <macro name>\nArguments:\n  input md.   = Path to model description file for which to generate UUID.\n  placeholder = String in input md. to replace with UUID in output md.\n  output md.  = Path of output model description file.\n  output hdr. = Path of output C header file that defines macro with UUID.\n  macro name  = A name for the macro that contains the UUID string.\n"
               ,0x1d5);
    std::ostream::flush();
  }
  else {
    if (argc != 6) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Wrong number of command-line arguments.");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,argv[1],&local_d9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,argv[2],&local_da);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,argv[3],&local_db);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,argv[4],&local_dc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,argv[5],&local_dd);
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    local_20 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/viproma[P]fmu-uuid/fmu-uuid.cpp:95:17)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/viproma[P]fmu-uuid/fmu-uuid.cpp:95:17)>
               ::_M_manager;
    Run(&local_58,&local_78,&local_98,&local_b8,&local_d8,
        (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return 0;
}

Assistant:

int main(int argc, const char* const argv[])
{
    try {
        if (argc < 2) {
            std::cout <<
                "Generates an UUID for an FMU.\n"
                "Usage:\n"
                "  " MY_NAME " <input md.> <placeholder> <output md.> <output hdr.> <macro name>\n"
                "Arguments:\n"
                "  input md.   = Path to model description file for which to generate UUID.\n"
                "  placeholder = String in input md. to replace with UUID in output md.\n"
                "  output md.  = Path of output model description file.\n"
                "  output hdr. = Path of output C header file that defines macro with UUID.\n"
                "  macro name  = A name for the macro that contains the UUID string.\n"
                << std::flush;
        } else if (argc != 6) {
            throw std::runtime_error("Wrong number of command-line arguments.");
        } else {
            Run(argv[1], argv[2], argv[3], argv[4], argv[5],
                [] (const std::string& s) { std::cerr << "Warning: " << s << std::endl; });
        }
    } catch (const std::logic_error& e) {
        std::cerr << "Internal error: " << e.what() << std::endl;
        return 2;
    } catch (const std::exception& e) {
        std::cerr << "Error: " << e.what() << std::endl;
        return 1;
    }
    return 0;
}